

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::GraphicsCacheTestInstance
          (GraphicsCacheTestInstance *this,Context *context,CacheTestParam *param)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  VkBool32 VVar2;
  VkBool32 VVar3;
  VkBuffer obj;
  pointer __src;
  Allocation *pAVar4;
  VkRenderPass obj_00;
  VkImage VVar5;
  deUint64 dVar6;
  VkImageView VVar7;
  VkFramebuffer VVar8;
  VkPipelineLayout obj_01;
  VkPipeline VVar9;
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar10;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar11;
  VkDevice device;
  long lVar12;
  DeviceInterface *pDVar13;
  VkPhysicalDeviceFeatures *pVVar14;
  NotSupportedError *this_00;
  CacheTestParam *entryName;
  char *pcVar15;
  VkShaderStageFlagBits stage;
  ulong uVar16;
  VkSubpassDescription subpassDescription;
  VkRenderPassCreateInfo renderPassParams;
  VkImageViewCreateInfo colorAttachmentViewParams;
  VkImageView attachmentBindInfos [2];
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *in_stack_fffffffffffffe10;
  undefined1 local_1e8 [8];
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1e0;
  undefined8 *local_1c8;
  undefined8 local_1c0;
  undefined8 *local_1b8;
  undefined4 local_1b0;
  undefined8 local_1a8;
  undefined1 local_198 [16];
  VkDevice local_188;
  VkAllocationCallbacks *pVStack_180;
  deUint32 local_178;
  VkSubpassDescription *local_170;
  deUint32 local_168;
  VkSubpassDependency *local_160;
  SimpleGraphicsPipelineBuilder *local_150;
  undefined1 local_148 [16];
  PFN_vkReallocationFunction local_138;
  VkImage VStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  VkComponentSwizzle VStack_118;
  VkComponentSwizzle VStack_114;
  VkImageAspectFlags VStack_110;
  deUint32 dStack_10c;
  deUint32 dStack_108;
  deUint32 dStack_104;
  deUint32 local_100;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_f0;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_e8;
  Move<vk::Handle<(vk::HandleType)13>_> *local_e0;
  Move<vk::Handle<(vk::HandleType)8>_> *local_d8;
  DeviceInterface *local_d0;
  Move<vk::Handle<(vk::HandleType)16>_> *local_c8;
  Move<vk::Handle<(vk::HandleType)17>_> *local_c0;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *local_b8;
  VkDevice local_b0;
  Move<vk::Handle<(vk::HandleType)17>_> local_a8;
  Move<vk::Handle<(vk::HandleType)9>_> *local_80;
  Handle<(vk::HandleType)17> local_78;
  DeviceInterface *pDStack_70;
  VkDevice local_68;
  VkAllocationCallbacks *pVStack_60;
  UVec2 local_50;
  UVec2 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  CacheTestInstance::CacheTestInstance(&this->super_CacheTestInstance,context,param);
  (this->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__GraphicsCacheTestInstance_00d55cf0;
  *(undefined8 *)(this->m_renderSize).m_data = 0x2000000020;
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_depthFormat = VK_FORMAT_D16_UNORM;
  local_c8 = &this->m_pipelineLayout;
  pMVar1 = &this->m_depthImage;
  local_f0 = &this->m_depthImageAlloc;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_depthImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  lVar12 = 0xf8;
  do {
    *(undefined8 *)
     ((long)&(this->super_CacheTestInstance).super_TestInstance._vptr_TestInstance + lVar12) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x118);
  local_e0 = &this->m_depthAttachmentView;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_d8 = &this->m_vertexBuffer;
  local_e8 = &this->m_vertexBufferMemory;
  local_b8 = &this->m_vertices;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150 = (SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_vertexBufferMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  (this->m_pipelineBuilder).m_context = context;
  (this->m_pipelineBuilder).m_patchControlPoints = 0;
  local_c0 = &this->m_renderPass;
  memset((this->m_pipelineBuilder).m_shaderModules,0,0xc4);
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0
  ;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0
  ;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_80 = pMVar1;
  pDVar13 = Context::getDeviceInterface
                      ((this->super_CacheTestInstance).super_TestInstance.m_context);
  local_b0 = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_1e8,
             (this->super_CacheTestInstance).super_TestInstance.m_context,0x400,0x80,local_e8);
  local_138 = (PFN_vkReallocationFunction)DStack_1e0.m_device;
  VStack_130.m_internal = (deUint64)DStack_1e0.m_allocator;
  local_148._0_8_ = local_1e8;
  local_148._8_8_ = DStack_1e0.m_deviceIface;
  local_1e8 = (undefined1  [8])0x0;
  DStack_1e0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1e0.m_device = (VkDevice)0x0;
  DStack_1e0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (local_d8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               obj);
  }
  (local_d8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device =
       (VkDevice)local_138;
  (local_d8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_130.m_internal;
  (local_d8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
       local_148._0_8_;
  (local_d8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_148._8_8_;
  if (local_1e8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_1e0,(VkBuffer)local_1e8);
  }
  createOverlappingQuads();
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  _M_move_assign(local_b8,(VkAllocationCallbacks *)local_148);
  if ((void *)local_148._0_8_ != (void *)0x0) {
    operator_delete((void *)local_148._0_8_,(long)local_138 - local_148._0_8_);
  }
  __src = (this->m_vertices).
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start;
  memcpy(((this->m_vertexBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,__src,
         (long)(this->m_vertices).
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
  device = local_b0;
  pAVar4 = (this->m_vertexBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (pDVar13,local_b0,(VkDeviceMemory)(pAVar4->m_memory).m_internal,pAVar4->m_offset,0x400);
  uStack_120._0_4_ = this->m_depthFormat;
  local_148._0_8_ = (ulong)this->m_colorFormat << 0x20;
  local_148._8_8_ = (PFN_vkAllocationFunction)0x100000001;
  local_138 = (PFN_vkReallocationFunction)0x200000000;
  VStack_130.m_internal = 0x200000001;
  local_128 = (PFN_vkInternalAllocationNotification)0x2;
  uStack_120._4_4_ = VK_COMPONENT_SWIZZLE_ZERO;
  VStack_118 = VK_COMPONENT_SWIZZLE_ZERO;
  VStack_114 = VK_COMPONENT_SWIZZLE_ZERO;
  VStack_110 = 2;
  dStack_10c = 1;
  dStack_108 = 3;
  dStack_104 = 3;
  local_1c8 = &local_38;
  local_38 = 0x200000000;
  local_1b8 = &local_40;
  local_40 = 0x300000001;
  local_1e8 = (undefined1  [8])0x0;
  DStack_1e0.m_deviceIface =
       (DeviceInterface *)((ulong)DStack_1e0.m_deviceIface & 0xffffffff00000000);
  DStack_1e0.m_device = (VkDevice)0x0;
  DStack_1e0.m_allocator = (VkAllocationCallbacks *)CONCAT44(DStack_1e0.m_allocator._4_4_,1);
  local_1c0 = 0;
  local_1b0 = 0;
  local_1a8 = 0;
  local_198._0_4_ = 0x26;
  local_198._8_8_ = (DeviceInterface *)0x0;
  local_188 = (VkDevice)0x200000000;
  local_178 = 1;
  local_168 = 0;
  local_160 = (VkSubpassDependency *)0x0;
  pVStack_180 = (VkAllocationCallbacks *)local_148;
  local_170 = (VkSubpassDescription *)local_1e8;
  ::vk::createRenderPass
            (&local_a8,pDVar13,device,(VkRenderPassCreateInfo *)local_198,
             (VkAllocationCallbacks *)0x0);
  pMVar11 = local_c0;
  local_68 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  pVStack_60 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  local_78.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pDStack_70 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (local_c0->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_00);
  }
  (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_device = local_68;
  (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_allocator = pVStack_60;
  (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       local_78.m_internal;
  (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_deviceIface =
       pDStack_70;
  if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkRenderPass)
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)local_1e8,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_colorFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x11,(int)this + 0xf8,
             in_stack_fffffffffffffe10);
  local_138 = (PFN_vkReallocationFunction)DStack_1e0.m_device;
  VStack_130.m_internal = (deUint64)DStack_1e0.m_allocator;
  local_148._0_8_ = local_1e8;
  local_148._8_8_ = DStack_1e0.m_deviceIface;
  local_1e8 = (undefined1  [8])0x0;
  DStack_1e0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1e0.m_device = (VkDevice)0x0;
  DStack_1e0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar5.m_internal =
       this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar5.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar5);
  }
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)local_138;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_130.m_internal;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_148._0_8_;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_148._8_8_;
  if (local_1e8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&DStack_1e0,(VkImage)local_1e8);
  }
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)local_1e8,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_colorFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x11,(int)this + 0x108,
             in_stack_fffffffffffffe10);
  local_138 = (PFN_vkReallocationFunction)DStack_1e0.m_device;
  VStack_130.m_internal = (deUint64)DStack_1e0.m_allocator;
  local_148._0_8_ = local_1e8;
  local_148._8_8_ = DStack_1e0.m_deviceIface;
  local_1e8 = (undefined1  [8])0x0;
  DStack_1e0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1e0.m_device = (VkDevice)0x0;
  DStack_1e0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar5.m_internal =
       this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar5.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar5);
  }
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)local_138;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_130.m_internal;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_148._0_8_;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_148._8_8_;
  if (local_1e8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&DStack_1e0,(VkImage)local_1e8);
  }
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)local_1e8,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_depthFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x20,
             (VkSampleCountFlagBits)local_f0,in_stack_fffffffffffffe10);
  local_138 = (PFN_vkReallocationFunction)DStack_1e0.m_device;
  VStack_130.m_internal = (deUint64)DStack_1e0.m_allocator;
  local_148._0_8_ = local_1e8;
  local_148._8_8_ = DStack_1e0.m_deviceIface;
  local_1e8 = (undefined1  [8])0x0;
  DStack_1e0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1e0.m_device = (VkDevice)0x0;
  DStack_1e0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar5.m_internal =
       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  if (VVar5.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar5);
  }
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)local_138;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_130.m_internal;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_148._0_8_
  ;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_148._8_8_;
  if (local_1e8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&DStack_1e0,(VkImage)local_1e8);
  }
  VStack_130.m_internal =
       this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  this->m_imageLayoutBarriers[0].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[0].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[0].srcAccessMask = 0;
  this->m_imageLayoutBarriers[0].dstAccessMask = 0x100;
  this->m_imageLayoutBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[0].newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[0].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].image.m_internal = VStack_130.m_internal;
  this->m_imageLayoutBarriers[0].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.layerCount = 1;
  dVar6 = this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
          m_internal;
  this->m_imageLayoutBarriers[1].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[1].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[1].srcAccessMask = 0;
  this->m_imageLayoutBarriers[1].dstAccessMask = 0x100;
  this->m_imageLayoutBarriers[1].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[1].newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[1].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].image.m_internal = dVar6;
  this->m_imageLayoutBarriers[1].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.layerCount = 1;
  dVar6 = (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
          m_internal;
  this->m_imageLayoutBarriers[2].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[2].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[2].srcAccessMask = 0;
  this->m_imageLayoutBarriers[2].dstAccessMask = 0x400;
  this->m_imageLayoutBarriers[2].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[2].newLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[2].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[2].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[2].image.m_internal = dVar6;
  this->m_imageLayoutBarriers[2].subresourceRange.aspectMask = 2;
  this->m_imageLayoutBarriers[2].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[2].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[2].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[2].subresourceRange.layerCount = 1;
  local_148._0_4_ = 0xf;
  local_148._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_138 = (PFN_vkReallocationFunction)((ulong)local_138 & 0xffffffff00000000);
  local_128 = (PFN_vkInternalAllocationNotification)CONCAT44(this->m_colorFormat,1);
  uStack_120._0_4_ = VK_COMPONENT_SWIZZLE_R;
  uStack_120._4_4_ = VK_COMPONENT_SWIZZLE_G;
  VStack_118 = VK_COMPONENT_SWIZZLE_B;
  VStack_114 = VK_COMPONENT_SWIZZLE_A;
  VStack_110 = 1;
  dStack_10c = 0;
  dStack_108 = 1;
  dStack_104 = 0;
  local_100 = 1;
  local_d0 = pDVar13;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_198,pDVar13,device,
             (VkImageViewCreateInfo *)local_148,(VkAllocationCallbacks *)0x0);
  DStack_1e0.m_device = local_188;
  DStack_1e0.m_allocator = pVStack_180;
  local_1e8 = (undefined1  [8])local_198._0_8_;
  DStack_1e0.m_deviceIface = (DeviceInterface *)local_198._8_8_;
  local_198._0_8_ = 0;
  local_198._8_8_ = (DeviceInterface *)0x0;
  local_188 = (VkDevice)0x0;
  pVStack_180 = (VkAllocationCallbacks *)0x0;
  VVar7.m_internal =
       this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar7.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
                .deleter,VVar7);
  }
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = DStack_1e0.m_device;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = DStack_1e0.m_allocator;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = (deUint64)local_1e8;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = DStack_1e0.m_deviceIface;
  if (local_198._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_198 + 8),
               (VkImageView)local_198._0_8_);
  }
  pDVar13 = local_d0;
  VStack_130.m_internal =
       this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_198,local_d0,device,
             (VkImageViewCreateInfo *)local_148,(VkAllocationCallbacks *)0x0);
  DStack_1e0.m_device = local_188;
  DStack_1e0.m_allocator = pVStack_180;
  local_1e8 = (undefined1  [8])local_198._0_8_;
  DStack_1e0.m_deviceIface = (DeviceInterface *)local_198._8_8_;
  local_198._0_8_ = 0;
  local_198._8_8_ = (DeviceInterface *)0x0;
  local_188 = (VkDevice)0x0;
  pVStack_180 = (VkAllocationCallbacks *)0x0;
  VVar7.m_internal =
       this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar7.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
                .deleter,VVar7);
  }
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = DStack_1e0.m_device;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = DStack_1e0.m_allocator;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = (deUint64)local_1e8;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = DStack_1e0.m_deviceIface;
  if (local_198._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_198 + 8),
               (VkImageView)local_198._0_8_);
  }
  local_148._0_4_ = 0xf;
  local_148._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_138 = (PFN_vkReallocationFunction)((ulong)local_138 & 0xffffffff00000000);
  VStack_130.m_internal =
       (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_128 = (PFN_vkInternalAllocationNotification)CONCAT44(this->m_depthFormat,1);
  uStack_120._0_4_ = VK_COMPONENT_SWIZZLE_R;
  uStack_120._4_4_ = VK_COMPONENT_SWIZZLE_G;
  VStack_118 = VK_COMPONENT_SWIZZLE_B;
  VStack_114 = VK_COMPONENT_SWIZZLE_A;
  VStack_110 = 2;
  dStack_10c = 0;
  dStack_108 = 1;
  dStack_104 = 0;
  local_100 = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_198,pDVar13,device,
             (VkImageViewCreateInfo *)local_148,(VkAllocationCallbacks *)0x0);
  DStack_1e0.m_device = local_188;
  DStack_1e0.m_allocator = pVStack_180;
  local_1e8 = (undefined1  [8])local_198._0_8_;
  DStack_1e0.m_deviceIface = (DeviceInterface *)local_198._8_8_;
  local_198._0_8_ = 0;
  local_198._8_8_ = (DeviceInterface *)0x0;
  local_188 = (VkDevice)0x0;
  pVStack_180 = (VkAllocationCallbacks *)0x0;
  VVar7.m_internal =
       (local_e0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar7.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar7);
  }
  (local_e0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
       DStack_1e0.m_device;
  (local_e0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
       DStack_1e0.m_allocator;
  (local_e0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       (deUint64)local_1e8;
  (local_e0->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
       DStack_1e0.m_deviceIface;
  if (local_198._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_198 + 8),
               (VkImageView)local_198._0_8_);
  }
  local_78.m_internal =
       this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  uStack_120 = (VkPushConstantRange *)&local_78;
  pDStack_70 = (DeviceInterface *)
               (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
               object.m_internal;
  local_148._0_4_ = 0x25;
  local_148._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_138 = (PFN_vkReallocationFunction)((ulong)local_138 & 0xffffffff00000000);
  VStack_130.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_128 = (PFN_vkInternalAllocationNotification)CONCAT44(local_128._4_4_,2);
  VStack_118 = (this->m_renderSize).m_data[0];
  VStack_114 = (this->m_renderSize).m_data[1];
  VStack_110 = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)local_198,pDVar13,device,
             (VkFramebufferCreateInfo *)local_148,(VkAllocationCallbacks *)0x0);
  DStack_1e0.m_device = local_188;
  DStack_1e0.m_allocator = pVStack_180;
  local_1e8 = (undefined1  [8])local_198._0_8_;
  DStack_1e0.m_deviceIface = (DeviceInterface *)local_198._8_8_;
  local_198._0_8_ = 0;
  local_198._8_8_ = (DeviceInterface *)0x0;
  local_188 = (VkDevice)0x0;
  pVStack_180 = (VkAllocationCallbacks *)0x0;
  VVar8.m_internal =
       this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
       m_internal;
  if (VVar8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter
               ,VVar8);
  }
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       DStack_1e0.m_device;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       DStack_1e0.m_allocator;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       (deUint64)local_1e8;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = DStack_1e0.m_deviceIface;
  if (local_198._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_198 + 8),
               (VkFramebuffer)local_198._0_8_);
  }
  local_78.m_internal =
       this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)local_198,local_d0,device,
             (VkFramebufferCreateInfo *)local_148,(VkAllocationCallbacks *)0x0);
  DStack_1e0.m_device = local_188;
  DStack_1e0.m_allocator = pVStack_180;
  local_1e8 = (undefined1  [8])local_198._0_8_;
  DStack_1e0.m_deviceIface = (DeviceInterface *)local_198._8_8_;
  local_198._0_8_ = 0;
  local_198._8_8_ = (DeviceInterface *)0x0;
  local_188 = (VkDevice)0x0;
  pVStack_180 = (VkAllocationCallbacks *)0x0;
  VVar8.m_internal =
       this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
       m_internal;
  if (VVar8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter
               ,VVar8);
  }
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       DStack_1e0.m_device;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       DStack_1e0.m_allocator;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       (deUint64)local_1e8;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = DStack_1e0.m_deviceIface;
  if (local_198._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_198 + 8),
               (VkFramebuffer)local_198._0_8_);
  }
  pVVar14 = Context::getDeviceFeatures((this->super_CacheTestInstance).super_TestInstance.m_context)
  ;
  entryName = (this->super_CacheTestInstance).m_param;
  if ((int)entryName->m_shaderCount != 0) {
    VVar2 = pVVar14->geometryShader;
    VVar3 = pVVar14->tessellationShader;
    uVar16 = 0;
    do {
      stage = entryName->m_shaders[uVar16];
      switch(stage) {
      case VK_SHADER_STAGE_VERTEX_BIT:
        pcVar15 = "color_vert";
        goto LAB_004a4ceb;
      case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
        pcVar15 = "basic_tcs";
        if (VVar3 == 0) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Tessellation Not Supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                     ,0x3fe);
LAB_004a4fb4:
          __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        goto LAB_004a4d0a;
      case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
           VK_SHADER_STAGE_VERTEX_BIT:
        break;
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
        pcVar15 = "basic_tes";
        if (VVar3 == 0) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Tessellation Not Supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                     ,0x409);
          goto LAB_004a4fb4;
        }
LAB_004a4d0a:
        SimpleGraphicsPipelineBuilder::bindShaderStage(local_150,stage,pcVar15,(char *)entryName);
        (this->m_pipelineBuilder).m_patchControlPoints = 3;
        break;
      case VK_SHADER_STAGE_GEOMETRY_BIT:
        stage = VK_SHADER_STAGE_GEOMETRY_BIT;
        pcVar15 = "dummy_geo";
        if (VVar2 == 0) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Geometry Shader Not Supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                     ,0x3f4);
          goto LAB_004a4fb4;
        }
LAB_004a4ceb:
        SimpleGraphicsPipelineBuilder::bindShaderStage(local_150,stage,pcVar15,(char *)entryName);
        break;
      default:
        if (stage == VK_SHADER_STAGE_FRAGMENT_BIT) {
          pcVar15 = "color_frag";
          goto LAB_004a4ceb;
        }
      }
      uVar16 = uVar16 + 1;
      entryName = (this->super_CacheTestInstance).m_param;
    } while (uVar16 < (uint)entryName->m_shaderCount);
  }
  local_148._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_128 = (PFN_vkInternalAllocationNotification)0x0;
  uStack_120._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  uStack_120._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_138 = (PFN_vkReallocationFunction)0x0;
  VStack_130.m_internal = 0;
  local_148._0_8_ = (void *)0x1e;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_198,local_d0,local_b0,
             (VkPipelineLayoutCreateInfo *)local_148,(VkAllocationCallbacks *)0x0);
  pMVar10 = local_c8;
  DStack_1e0.m_device = local_188;
  DStack_1e0.m_allocator = pVStack_180;
  local_1e8 = (undefined1  [8])local_198._0_8_;
  DStack_1e0.m_deviceIface = (DeviceInterface *)local_198._8_8_;
  local_198._0_8_ = 0;
  local_198._8_8_ = (DeviceInterface *)0x0;
  local_188 = (VkDevice)0x0;
  pVStack_180 = (VkAllocationCallbacks *)0x0;
  obj_01.m_internal =
       (local_c8->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_01);
  }
  (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device =
       DStack_1e0.m_device;
  (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator =
       DStack_1e0.m_allocator;
  (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       (deUint64)local_1e8;
  (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
       DStack_1e0.m_deviceIface;
  if (local_198._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_198 + 8),
               (VkPipelineLayout)local_198._0_8_);
  }
  local_48.m_data = *&(this->m_renderSize).m_data;
  SimpleGraphicsPipelineBuilder::buildPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_1e8,local_150,&local_48,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkPipelineCache)
             (this->super_CacheTestInstance).m_cache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.
             m_data.object.m_internal,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal);
  local_138 = (PFN_vkReallocationFunction)DStack_1e0.m_device;
  VStack_130.m_internal = (deUint64)DStack_1e0.m_allocator;
  local_148._0_8_ = local_1e8;
  local_148._8_8_ = DStack_1e0.m_deviceIface;
  local_1e8 = (undefined1  [8])0x0;
  DStack_1e0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1e0.m_device = (VkDevice)0x0;
  DStack_1e0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar9.m_internal =
       this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (VVar9.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               VVar9);
  }
  this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)local_138;
  this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_130.m_internal;
  this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_148._0_8_;
  this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_148._8_8_;
  if (local_1e8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&DStack_1e0,(VkPipeline)local_1e8);
  }
  local_50.m_data = *&(this->m_renderSize).m_data;
  SimpleGraphicsPipelineBuilder::buildPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_1e8,local_150,&local_50,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkPipelineCache)
             (this->super_CacheTestInstance).m_cache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.
             m_data.object.m_internal,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal);
  local_138 = (PFN_vkReallocationFunction)DStack_1e0.m_device;
  VStack_130.m_internal = (deUint64)DStack_1e0.m_allocator;
  local_148._0_8_ = local_1e8;
  local_148._8_8_ = DStack_1e0.m_deviceIface;
  local_1e8 = (undefined1  [8])0x0;
  DStack_1e0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1e0.m_device = (VkDevice)0x0;
  DStack_1e0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar9.m_internal =
       this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (VVar9.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               VVar9);
  }
  this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)local_138;
  this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_130.m_internal;
  this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_148._0_8_;
  this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_148._8_8_;
  if (local_1e8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&DStack_1e0,(VkPipeline)local_1e8);
  }
  return;
}

Assistant:

GraphicsCacheTestInstance::GraphicsCacheTestInstance (Context&              context,
													  const CacheTestParam* param)
	: CacheTestInstance (context,param)
	, m_renderSize      (32u, 32u)
	, m_colorFormat     (VK_FORMAT_R8G8B8A8_UNORM)
	, m_depthFormat     (VK_FORMAT_D16_UNORM)
	, m_pipelineBuilder (context)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create vertex buffer
	{
		m_vertexBuffer = createBufferAndBindMemory(m_context, 1024u, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT, &m_vertexBufferMemory);

		m_vertices          = createOverlappingQuads();
		// Load vertices into vertex buffer
		deMemcpy(m_vertexBufferMemory->getHostPtr(), m_vertices.data(), m_vertices.size() * sizeof(Vertex4RGBA));
		flushMappedMemoryRange(vk, vkDevice, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset(), 1024u);
	}

	// Create render pass
	{
		const VkAttachmentDescription colorAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags    flags;
			m_colorFormat,                                      // VkFormat                        format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits           samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp              loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,                       // VkAttachmentStoreOp             storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp              stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp             stencilStoreOp;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   finalLayout;
		};

		const VkAttachmentDescription depthAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags flags;
			m_depthFormat,                                      // VkFormat                     format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits        samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp           loadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp           stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          stencilStoreOp;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                initialLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                finalLayout;
		};

		const VkAttachmentDescription attachments[2] =
		{
			colorAttachmentDescription,
			depthAttachmentDescription
		};

		const VkAttachmentReference colorAttachmentReference =
		{
			0u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL            // VkImageLayout    layout;
		};

		const VkAttachmentReference depthAttachmentReference =
		{
			1u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL    // VkImageLayout    layout;
		};

		const VkSubpassDescription subpassDescription =
		{
			0u,                                                 // VkSubpassDescriptionFlags        flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,                    // VkPipelineBindPoint              pipelineBindPoint;
			0u,                                                 // deUint32                         inputAttachmentCount;
			DE_NULL,                                            // const VkAttachmentReference*     pInputAttachments;
			1u,                                                 // deUint32                         colorAttachmentCount;
			&colorAttachmentReference,                          // const VkAttachmentReference*     pColorAttachments;
			DE_NULL,                                            // const VkAttachmentReference*     pResolveAttachments;
			&depthAttachmentReference,                          // const VkAttachmentReference*     pDepthStencilAttachment;
			0u,                                                 // deUint32                         preserveAttachmentCount;
			DE_NULL                                             // const VkAttachmentReference*     pPreserveAttachments;
		};

		const VkRenderPassCreateInfo renderPassParams =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,          // VkStructureType                  sType;
			DE_NULL,                                            // const void*                      pNext;
			0u,                                                 // VkRenderPassCreateFlags          flags;
			2u,                                                 // deUint32                         attachmentCount;
			attachments,                                        // const VkAttachmentDescription*   pAttachments;
			1u,                                                 // deUint32                         subpassCount;
			&subpassDescription,                                // const VkSubpassDescription*      pSubpasses;
			0u,                                                 // deUint32                         dependencyCount;
			DE_NULL                                             // const VkSubpassDependency*       pDependencies;
		};

		m_renderPass = createRenderPass(vk, vkDevice, &renderPassParams);
	}

	const VkComponentMapping    ComponentMappingRGBA = { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A};
	// Create color image
	{
		m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE] = createImage2DAndBindMemory(m_context,
																			   m_colorFormat,
																			   m_renderSize.x(),
																			   m_renderSize.y(),
																			   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
																			   VK_SAMPLE_COUNT_1_BIT,
																			   &m_colorImageAlloc[PIPELINE_CACHE_NDX_NO_CACHE]);
		m_colorImage[PIPELINE_CACHE_NDX_CACHED]   = createImage2DAndBindMemory(m_context,
																			   m_colorFormat,
																			   m_renderSize.x(),
																			   m_renderSize.y(),
																			   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
																			   VK_SAMPLE_COUNT_1_BIT,
																			   &m_colorImageAlloc[PIPELINE_CACHE_NDX_CACHED]);
	}

	// Create depth image
	{
		m_depthImage = createImage2DAndBindMemory(m_context,
												  m_depthFormat,
												  m_renderSize.x(),
												  m_renderSize.y(),
												  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_depthImageAlloc);
	}

	// Set up image layout transition barriers
	{
		VkImageMemoryBarrier colorImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],			// VkImage					image;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[0] = colorImageBarrier;

		colorImageBarrier.image = *m_colorImage[PIPELINE_CACHE_NDX_CACHED];
		m_imageLayoutBarriers[1] = colorImageBarrier;

		const VkImageMemoryBarrier depthImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_depthImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[2] = depthImageBarrier;
	}
	// Create color attachment view
	{
		VkImageViewCreateInfo colorAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],     // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			m_colorFormat,                                  // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_colorAttachmentView[PIPELINE_CACHE_NDX_NO_CACHE] = createImageView(vk, vkDevice, &colorAttachmentViewParams);

		colorAttachmentViewParams.image = *m_colorImage[PIPELINE_CACHE_NDX_CACHED];
		m_colorAttachmentView[PIPELINE_CACHE_NDX_CACHED] = createImageView(vk, vkDevice, &colorAttachmentViewParams);
	}

	// Create depth attachment view
	{
		const VkImageViewCreateInfo depthAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_depthImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			m_depthFormat,                                  // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_depthAttachmentView = createImageView(vk, vkDevice, &depthAttachmentViewParams);
	}

	// Create framebuffer
	{
		VkImageView attachmentBindInfos[2] =
		{
			*m_colorAttachmentView[PIPELINE_CACHE_NDX_NO_CACHE],
			*m_depthAttachmentView,
		};

		const VkFramebufferCreateInfo framebufferParams =
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,          // VkStructureType              sType;
			DE_NULL,                                            // const void*                  pNext;
			0u,                                                 // VkFramebufferCreateFlags     flags;
			*m_renderPass,                                      // VkRenderPass                 renderPass;
			2u,                                                 // deUint32                     attachmentCount;
			attachmentBindInfos,                                // const VkImageView*           pAttachments;
			(deUint32)m_renderSize.x(),                         // deUint32                     width;
			(deUint32)m_renderSize.y(),                         // deUint32                     height;
			1u,                                                 // deUint32                     layers;
		};

		m_framebuffer[PIPELINE_CACHE_NDX_NO_CACHE] = createFramebuffer(vk, vkDevice, &framebufferParams);

		attachmentBindInfos[0] = *m_colorAttachmentView[PIPELINE_CACHE_NDX_CACHED];
		m_framebuffer[PIPELINE_CACHE_NDX_CACHED] = createFramebuffer(vk, vkDevice, &framebufferParams);
	}

	// Bind shader stages
	VkPhysicalDeviceFeatures  features = m_context.getDeviceFeatures();
	for (deUint32 shaderNdx = 0; shaderNdx < m_param->getShaderCount(); shaderNdx++)
	{
		switch(m_param->getShaderFlag(shaderNdx))
		{
			case VK_SHADER_STAGE_VERTEX_BIT:
				m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_VERTEX_BIT, "color_vert", "main");
				break;
			case VK_SHADER_STAGE_FRAGMENT_BIT:
				m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_FRAGMENT_BIT, "color_frag", "main");
				break;
			case VK_SHADER_STAGE_GEOMETRY_BIT:
				if (features.geometryShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Geometry Shader Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_GEOMETRY_BIT, "dummy_geo", "main");
				}
				break;
			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				if (features.tessellationShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Tessellation Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT, "basic_tcs", "main");
					m_pipelineBuilder.enableTessellationStage(3);
				}
				break;
			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
				if (features.tessellationShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Tessellation Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, "basic_tes", "main");
					m_pipelineBuilder.enableTessellationStage(3);
				}
				break;
			default:
				DE_FATAL("Unknown Shader Stage!");
				break;
		};
	}

	// Create pipeline layout
	{
		const VkPipelineLayoutCreateInfo pipelineLayoutParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkPipelineLayoutCreateFlags		flags;
			0u,													// deUint32							setLayoutCount;
			DE_NULL,											// const VkDescriptorSetLayout*		pSetLayouts;
			0u,													// deUint32							pushConstantRangeCount;
			DE_NULL												// const VkPushConstantRange*		pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vk, vkDevice, &pipelineLayoutParams);
	}

	m_pipeline[PIPELINE_CACHE_NDX_NO_CACHE]	= m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cache, *m_pipelineLayout);
	m_pipeline[PIPELINE_CACHE_NDX_CACHED]	= m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cache, *m_pipelineLayout);
}